

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
          unsigned_long *arg_1)

{
  pointer pcVar1;
  size_type sVar2;
  Nonnull<char_*> pcVar3;
  size_t in_R9;
  string_view data;
  string_view format_00;
  string result;
  char *local_b0;
  size_t local_a8;
  char local_a0;
  undefined7 uStack_9f;
  Output *local_90;
  size_type local_88;
  pointer local_80;
  long local_78;
  Nonnull<char_*> local_70;
  long local_60;
  Nonnull<char_*> local_58;
  char local_50 [32];
  
  format_00._M_len = format._M_str;
  pcVar1 = (arg->_M_dataplus)._M_p;
  sVar2 = arg->_M_string_length;
  local_90 = this;
  pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer(*arg_1,local_50);
  local_78 = (long)pcVar3 - (long)local_50;
  local_a8 = 0;
  local_a0 = '\0';
  format_00._M_str = (char *)&local_88;
  local_b0 = &local_a0;
  local_88 = sVar2;
  local_80 = pcVar1;
  local_70 = local_50;
  local_60 = local_78;
  local_58 = local_50;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_b0,(Nonnull<std::string_*>)format._M_len,format_00,
             (Nullable<const_absl::string_view_*>)0x2,in_R9);
  data._M_str = local_b0;
  data._M_len = local_a8;
  Write(local_90,data);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }